

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_all_seg.c
# Opt level: O3

int agg_all_seg(feat_t *fcb,segdmp_type_t type,char *fn,uint32 stride)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  cmd_ln_t *cmdln;
  uint32 *puVar4;
  FILE *pFVar5;
  long lVar6;
  char *pcVar7;
  mfcc_t ***feat;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int32 iVar11;
  int32 n_frame;
  vector_t *mfcc;
  uint32 ignore;
  uint32 n_out_frame;
  uint local_80;
  int local_7c;
  vector_t *local_78;
  uint32 local_6c;
  uint32 local_68;
  undefined4 local_64;
  uint local_60;
  uint32 local_5c;
  feat_t *local_58;
  FILE *local_50;
  char *local_48;
  long local_40;
  long local_38;
  
  local_78 = (vector_t *)0x0;
  cmdln = cmd_ln_get();
  local_38 = cmd_ln_int_r(cmdln,"-ceplen");
  local_68 = 0;
  uVar8 = fcb->n_sv;
  if (uVar8 == 0) {
    uVar8 = fcb->n_stream;
  }
  if (fcb->lda == (mfcc_t ***)0x0) {
    puVar4 = fcb->sv_len;
    if (puVar4 == (uint32 *)0x0) {
      puVar4 = fcb->stream_len;
    }
  }
  else {
    puVar4 = &fcb->out_dim;
  }
  local_64 = 0;
  if (uVar8 == 0) {
    iVar11 = 0;
  }
  else {
    uVar10 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + puVar4[uVar10];
      uVar10 = uVar10 + 1;
      local_64 = (undefined4)uVar10;
    } while (uVar8 != uVar10);
  }
  s3clr_fattr();
  pFVar5 = (FILE *)s3open(fn,"wb",(uint32 *)0x0);
  if (pFVar5 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                   ,0x47,"Unable to open %s for writing.");
  }
  lVar6 = ftell(pFVar5);
  iVar1 = bio_fwrite(&local_64,4,1,(FILE *)pFVar5,0,&local_68);
  if (iVar1 == 1) {
    local_50 = pFVar5;
    local_48 = fn;
    local_40 = lVar6;
    local_6c = corpus_get_begin();
    local_60 = 0;
    iVar2 = corpus_next_utt();
    if (iVar2 != 0) {
      iVar2 = 0;
      feat = (mfcc_t ***)0x0;
      local_80 = 0;
      local_5c = stride;
      local_58 = fcb;
      do {
        if (local_78 != (vector_t *)0x0) {
          free(*local_78);
          ckd_free(local_78);
          local_78 = (vector_t *)0x0;
        }
        iVar3 = corpus_get_generic_featurevec(&local_78,&local_7c,(uint32)local_38);
        if (iVar3 < 0) {
          pcVar7 = corpus_utt();
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                  ,0x7d,"Can\'t read input features from %s\n",pcVar7);
LAB_00103e1f:
          exit(1);
        }
        if ((local_6c * 0x26e978d5 >> 3 | local_6c * -0x60000000) < 0x418938) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                  ,0x81,"[%u]\n",(ulong)local_6c);
        }
        if (feat != (mfcc_t ***)0x0) {
          feat_array_free(feat);
        }
        if (local_7c < 9) {
          pcVar7 = corpus_utt();
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                  ,0x8a,"utt %s too short\n",pcVar7);
          if (local_78 != (vector_t *)0x0) {
            ckd_free(*local_78);
            ckd_free(local_78);
            local_78 = (vector_t *)0x0;
          }
          feat = (mfcc_t ***)0x0;
        }
        else {
          feat = feat_array_alloc(fcb,local_7c + fcb->window_size);
          feat_s2mfc2feat_live(fcb,(mfcc_t **)local_78,&local_7c,1,1,feat);
          uVar8 = fcb->window_size;
          uVar9 = (ulong)uVar8;
          uVar10 = uVar9;
          iVar3 = local_7c;
          if (uVar8 < local_7c - uVar8) {
            do {
              if (local_80 % stride == 0) {
                iVar3 = 10;
                if (10 < iVar2) {
                  iVar3 = iVar2;
                }
                while (iVar1 = bio_fwrite(*feat[uVar10],4,iVar11,(FILE *)local_50,0,&local_68),
                      iVar1 != iVar11) {
                  err_msg_system(ERR_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                                 ,0x9f,"Unable to write to dmp file");
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                          ,0xa0,"sleeping...\n");
                  iVar2 = iVar2 + 1;
                  sleep(3);
                  if (iVar3 + 1 == iVar2) {
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                            ,0xa6,
                            "Failed to write to a dmp file after 10 retries of getting MFCC(about 30 seconds)\n "
                           );
                    goto LAB_00103e1f;
                  }
                }
                local_60 = local_60 + 1;
                uVar9 = (ulong)(uint)local_58->window_size;
                stride = local_5c;
                iVar3 = local_7c;
              }
              uVar10 = uVar10 + 1;
              local_80 = local_80 + 1;
              fcb = local_58;
            } while (uVar10 < (uint)(iVar3 - (int)uVar9));
          }
        }
        local_6c = local_6c + 1;
        iVar3 = corpus_next_utt();
      } while (iVar3 != 0);
    }
    pFVar5 = local_50;
    iVar2 = fseek(local_50,local_40,0);
    if (iVar2 < 0) {
      pcVar7 = "Unable to seek to begin of dmp";
      lVar6 = 0xaf;
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
              ,0xb4,"Wrote %u frames to %s\n",(ulong)local_60,local_48);
      iVar11 = bio_fwrite(&local_60,4,1,(FILE *)pFVar5,0,&local_68);
      if (iVar11 == 1) {
        return 0;
      }
      pcVar7 = "Unable to write to dmp file";
      lVar6 = 0xb7;
    }
  }
  else {
    pcVar7 = "Unable to write to dmp file";
    lVar6 = 0x6d;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                 ,lVar6,pcVar7);
  return -1;
}

Assistant:

int
agg_all_seg(feat_t *fcb,
	    segdmp_type_t type,
	    const char *fn,
	    uint32 stride)
{
    uint32 seq_no;
    vector_t *mfcc = NULL;
    uint32 mfc_veclen = cmd_ln_int32("-ceplen");
    int32 n_frame;
    uint32 n_out_frame;
    uint32 blksz=0;
    vector_t **feat = NULL;
    uint32 i, j;
    uint32 t;
    uint32 n_stream;
    uint32 *veclen;
    FILE *fp;
    uint32 ignore = 0;
    long start;
    int32 no_retries=0;
    
    n_stream = feat_dimension1(fcb);
    veclen = feat_stream_lengths(fcb);
    for (i = 0, blksz = 0; i < n_stream; i++)
        blksz += veclen[i];

    fp = open_dmp(fn);

    start = ftell(fp);

    if (bio_fwrite(&i, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	E_ERROR_SYSTEM("Unable to write to dmp file");

	return S3_ERROR;
    }

    for (seq_no = corpus_get_begin(), j = 0, n_out_frame = 0;
	 corpus_next_utt(); seq_no++) {
	    if (mfcc) {
		free(mfcc[0]);
		ckd_free(mfcc);

		mfcc = NULL;
	    }

	    /* get the MFCC data for the utterance */
	    if (corpus_get_generic_featurevec(&mfcc, &n_frame, mfc_veclen) < 0) {
	      E_FATAL("Can't read input features from %s\n", corpus_utt());
	    }

	if ((seq_no % 1000) == 0) {
	    E_INFO("[%u]\n", seq_no);
	}

	    if (feat) {
		feat_array_free(feat);
		feat = NULL;
	    }
	    
	    if (n_frame < 9) {
	      E_WARN("utt %s too short\n", corpus_utt());
	      if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	      }
	      continue;
	    }

	    feat = feat_array_alloc(fcb, n_frame + feat_window_size(fcb));
	    feat_s2mfc2feat_live(fcb, mfcc, &n_frame, TRUE, TRUE, feat);

	    for (t = feat_window_size(fcb); t < n_frame - feat_window_size(fcb); t++, j++) {
		if ((j % stride) == 0) {
		    while (bio_fwrite(&feat[t][0][0],
				   sizeof(float32),
				   blksz,
				   fp, 0, &ignore) != blksz) {
			static int rpt = 0;

			if (!rpt) {
			    E_ERROR_SYSTEM("Unable to write to dmp file");
			    E_INFO("sleeping...\n");
			    no_retries++;
			}
			sleep(3);

			if(no_retries > 10){
			  E_FATAL("Failed to write to a dmp file after 10 retries of getting MFCC(about 30 seconds)\n ");
			}
		    }
		    ++n_out_frame;
		}
	    }
    }

    if (fseek(fp, start, SEEK_SET) < 0) {
	E_ERROR_SYSTEM("Unable to seek to begin of dmp");

	return S3_ERROR;
    }

    E_INFO("Wrote %u frames to %s\n", n_out_frame, fn);

    if (bio_fwrite((void *)&n_out_frame, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	E_ERROR_SYSTEM("Unable to write to dmp file");
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}